

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O0

int32_t ucase_toFullFolding_63(UChar32 c,UChar **pString,uint32_t options)

{
  ushort uVar1;
  ushort uVar2;
  sbyte sVar3;
  uint uVar4;
  undefined2 *puVar5;
  int iVar6;
  long lVar7;
  uint local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  uint local_48;
  int32_t delta;
  int32_t idx;
  int32_t full;
  uint16_t excWord;
  uint16_t *pe2;
  uint16_t *pe;
  uint local_20;
  uint16_t props;
  UChar32 result;
  uint32_t options_local;
  UChar **pString_local;
  UChar32 c_local;
  
  uVar4 = c >> 5;
  if ((uint)c < 0xd800) {
    local_54 = (uint)ucase_props_trieIndex[(int)uVar4] * 4 + (c & 0x1fU);
  }
  else {
    if ((uint)c < 0x10000) {
      iVar6 = 0;
      if (c < 0xdc00) {
        iVar6 = 0x140;
      }
      local_58 = (uint)ucase_props_trieIndex[(int)(iVar6 + uVar4)] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x110000) {
        if (c < 0xe0800) {
          local_60 = (uint)ucase_props_trieIndex
                           [(int)((uint)ucase_props_trieIndex[(c >> 0xb) + 0x820] + (uVar4 & 0x3f))]
                     * 4 + (c & 0x1fU);
        }
        else {
          local_60 = 0x2f1c;
        }
        local_5c = local_60;
      }
      else {
        local_5c = 0xd30;
      }
      local_58 = local_5c;
    }
    local_54 = local_58;
  }
  uVar1 = ucase_props_trieIndex[local_54];
  if ((uVar1 & 8) == 0) {
    local_20 = c;
    if ((uVar1 & 2) != 0) {
      local_20 = c + ((int)(short)uVar1 >> 7);
    }
  }
  else {
    lVar7 = (long)((int)(uint)uVar1 >> 4) * 2 + 0x408602;
    uVar2 = ucase_props_exceptions[(int)(uint)uVar1 >> 4];
    if ((uVar2 & 0x8000) == 0) {
      if ((uVar2 & 0x80) != 0) {
        if ((uVar2 & 0x100) == 0) {
          pe2 = (uint16_t *)(lVar7 + (long)(int)(uint)""[(int)(uVar2 & 0x7f)] * 2);
          delta = (int32_t)*pe2;
        }
        else {
          puVar5 = (undefined2 *)(lVar7 + (long)(int)((uint)""[(int)(uVar2 & 0x7f)] << 1) * 2);
          pe2 = puVar5 + 1;
          delta = CONCAT22(*puVar5,*pe2);
        }
        uVar4 = delta >> 4 & 0xf;
        if (uVar4 != 0) {
          *pString = (UChar *)(pe2 + (long)(int)(delta & 0xf) + 1);
          return uVar4;
        }
      }
    }
    else if ((options & 7) == 0) {
      if (c == 0x49) {
        return 0x69;
      }
      if (c == 0x130) {
        *pString = L"i̇";
        return 2;
      }
    }
    else {
      if (c == 0x49) {
        return 0x131;
      }
      if (c == 0x130) {
        return 0x69;
      }
    }
    if ((uVar2 & 0x200) != 0) {
      return c ^ 0xffffffff;
    }
    if (((uVar2 & 0x10) != 0) && ((uVar1 & 2) != 0)) {
      if ((uVar2 & 0x100) == 0) {
        local_48 = (uint)*(ushort *)(lVar7 + (long)(int)(uint)""[(int)(uVar2 & 0xf)] * 2);
      }
      else {
        puVar5 = (undefined2 *)(lVar7 + (long)(int)((uint)""[(int)(uVar2 & 0xf)] << 1) * 2);
        local_48 = CONCAT22(*puVar5,puVar5[1]);
      }
      if ((uVar2 & 0x400) != 0) {
        local_48 = -local_48;
      }
      local_64 = c + local_48;
      return local_64;
    }
    if ((uVar2 & 2) == 0) {
      if ((uVar2 & 1) == 0) {
        return c ^ 0xffffffff;
      }
      sVar3 = 0;
    }
    else {
      sVar3 = 1;
    }
    if ((uVar2 & 0x100) == 0) {
      local_20 = (uint)*(ushort *)
                        (lVar7 + (long)(int)(uint)""[(int)((uint)uVar2 & (1 << sVar3) - 1U)] * 2);
    }
    else {
      puVar5 = (undefined2 *)
               (lVar7 + (long)(int)((uint)""[(int)((uint)uVar2 & (1 << sVar3) - 1U)] << 1) * 2);
      local_20 = CONCAT22(*puVar5,puVar5[1]);
    }
  }
  if (local_20 == c) {
    local_68 = local_20 ^ 0xffffffff;
  }
  else {
    local_68 = local_20;
  }
  return local_68;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucase_toFullFolding(UChar32 c,
                    const UChar **pString,
                    uint32_t options) {
    // The sign of the result has meaning, input must be non-negative so that it can be returned as is.
    U_ASSERT(c >= 0);
    UChar32 result=c;
    uint16_t props=UTRIE2_GET16(&ucase_props_singleton.trie, c);
    if(!UCASE_HAS_EXCEPTION(props)) {
        if(UCASE_IS_UPPER_OR_TITLE(props)) {
            result=c+UCASE_GET_DELTA(props);
        }
    } else {
        const uint16_t *pe=GET_EXCEPTIONS(&ucase_props_singleton, props), *pe2;
        uint16_t excWord=*pe++;
        int32_t full, idx;

        pe2=pe;

        if(excWord&UCASE_EXC_CONDITIONAL_FOLD) {
            /* use hardcoded conditions and mappings */
            if((options&_FOLD_CASE_OPTIONS_MASK)==U_FOLD_CASE_DEFAULT) {
                /* default mappings */
                if(c==0x49) {
                    /* 0049; C; 0069; # LATIN CAPITAL LETTER I */
                    return 0x69;
                } else if(c==0x130) {
                    /* 0130; F; 0069 0307; # LATIN CAPITAL LETTER I WITH DOT ABOVE */
                    *pString=iDot;
                    return 2;
                }
            } else {
                /* Turkic mappings */
                if(c==0x49) {
                    /* 0049; T; 0131; # LATIN CAPITAL LETTER I */
                    return 0x131;
                } else if(c==0x130) {
                    /* 0130; T; 0069; # LATIN CAPITAL LETTER I WITH DOT ABOVE */
                    return 0x69;
                }
            }
        } else if(HAS_SLOT(excWord, UCASE_EXC_FULL_MAPPINGS)) {
            GET_SLOT_VALUE(excWord, UCASE_EXC_FULL_MAPPINGS, pe, full);

            /* start of full case mapping strings */
            ++pe;

            /* skip the lowercase result string */
            pe+=full&UCASE_FULL_LOWER;
            full=(full>>4)&0xf;

            if(full!=0) {
                /* set the output pointer to the result string */
                *pString=reinterpret_cast<const UChar *>(pe);

                /* return the string length */
                return full;
            }
        }

        if((excWord&UCASE_EXC_NO_SIMPLE_CASE_FOLDING)!=0) {
            return ~c;
        }
        if(HAS_SLOT(excWord, UCASE_EXC_DELTA) && UCASE_IS_UPPER_OR_TITLE(props)) {
            int32_t delta;
            GET_SLOT_VALUE(excWord, UCASE_EXC_DELTA, pe2, delta);
            return (excWord&UCASE_EXC_DELTA_IS_NEGATIVE)==0 ? c+delta : c-delta;
        }
        if(HAS_SLOT(excWord, UCASE_EXC_FOLD)) {
            idx=UCASE_EXC_FOLD;
        } else if(HAS_SLOT(excWord, UCASE_EXC_LOWER)) {
            idx=UCASE_EXC_LOWER;
        } else {
            return ~c;
        }
        GET_SLOT_VALUE(excWord, idx, pe2, result);
    }

    return (result==c) ? ~result : result;
}